

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.cpp
# Opt level: O2

int arangodb::velocypack::fpconv_dtoa(double d,char *dest)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong rem;
  byte bVar6;
  uint uVar7;
  uint64_t frac;
  uint64_t kappa;
  uint uVar8;
  uint64_t bits;
  long lVar9;
  ulong uVar10;
  char *__dest;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  char cVar15;
  ulong rem_00;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  Fp FVar19;
  Fp FVar20;
  Fp FVar21;
  char digits [18];
  Fp local_70;
  Fp local_60;
  Fp local_50;
  Fp local_40;
  
  bVar18 = (long)d < 0;
  if (bVar18) {
    *dest = '-';
  }
  __dest = dest + bVar18;
  if ((d != 0.0) || (NAN(d))) {
    if ((~(ulong)d & 0x7ff0000000000000) != 0) {
      digits[0] = '\0';
      uVar3 = (uint)((ulong)d >> 0x20);
      uVar11 = uVar3 >> 0x14 & 0x7ff;
      uVar10 = (ulong)d & 0xfffffffffffff | 0x10000000000000;
      if (uVar11 == 0) {
        uVar10 = (ulong)d & 0xfffffffffffff;
      }
      iVar13 = uVar11 + (uVar11 == 0);
      local_70.exp = 0x43e - iVar13;
      iVar13 = iVar13 + -999;
      cVar15 = '\v';
      for (uVar5 = uVar10 * 2 + 1; (uVar5 >> 0x35 & 1) == 0; uVar5 = uVar5 * 2) {
        cVar15 = cVar15 + '\x01';
        iVar13 = iVar13 + -1;
        local_70.exp = local_70.exp + 1;
      }
      local_70.frac = uVar5 << 10;
      local_70.exp = -local_70.exp;
      local_60.frac =
           (uVar10 << (uVar10 == 0x10000000000000) + 1) + -1 <<
           (~(uVar10 == 0x10000000000000) + cVar15 & 0x3fU);
      local_50.exp = (uVar11 - 0x43e) + (uint)(uVar11 == 0);
      for (; (uVar10 & 0x10000000000000) == 0; uVar10 = uVar10 * 2) {
        local_50.exp = local_50.exp + -1;
      }
      local_50.frac = uVar10 << 0xb;
      uVar10 = (long)((int)((double)-iVar13 * 0.30102999566398114) + 0x15c) / 8 & 0xffffffff;
      while( true ) {
        iVar13 = (int)uVar10;
        local_40.exp = powers_ten[iVar13].exp;
        iVar12 = 1;
        if ((-0x7d < local_70.exp + local_40.exp) &&
           (iVar12 = -1, local_70.exp + local_40.exp < -0x5f)) break;
        uVar10 = (ulong)(uint)(iVar13 + iVar12);
      }
      local_40.frac = powers_ten[iVar13].frac;
      local_60.exp = local_70.exp;
      FVar19 = multiply(&local_50,&local_40);
      FVar20 = multiply(&local_70,&local_40);
      FVar21 = multiply(&local_60,&local_40);
      uVar10 = FVar20.frac - 1;
      frac = uVar10 - FVar19.frac;
      bVar6 = -(char)FVar20.exp;
      kappa = 1L << (bVar6 & 0x3f);
      uVar14 = (~FVar21.frac + FVar20.frac) - 1;
      uVar5 = kappa - 1;
      rem_00 = uVar5 & uVar10;
      uVar10 = uVar10 >> (bVar6 & 0x3f);
      lVar9 = 0;
      iVar12 = 0;
LAB_0010c004:
      if ((int)lVar9 != 10) goto code_r0x0010c00d;
      uVar10 = 0;
      do {
        uVar16 = uVar10;
        uVar10 = rem_00 * 10 >> (bVar6 & 0x3f);
        iVar4 = 0;
        if ((int)uVar10 != 0 || iVar12 != 0) {
          digits[iVar12] = (char)uVar10 + '0';
          iVar4 = iVar12 + 1;
        }
        iVar12 = iVar4;
        uVar14 = uVar14 * 10;
        rem_00 = rem_00 * 10 & uVar5;
        uVar10 = uVar16 - 1;
      } while (uVar14 <= rem_00);
      round_digit(digits,iVar12,uVar14,rem_00,kappa,frac * tens[uVar16 + 0x12]);
      goto LAB_0010c101;
    }
    if (((ulong)d & 0xfffffffffffff) == 0) {
      __dest[0] = 'i';
      __dest[1] = 'n';
      __dest[2] = 'f';
    }
    else {
      __dest[0] = 'N';
      __dest[1] = 'a';
      __dest[2] = 'N';
    }
    uVar17 = 3;
  }
  else {
    *__dest = '0';
    uVar17 = 1;
  }
  goto LAB_0010c1fc;
code_r0x0010c00d:
  uVar16 = tens[lVar9 + 10];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar16;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar10;
  auVar2 = auVar2 / auVar1;
  iVar4 = 0;
  if (iVar12 != 0 || (auVar2 & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0) {
    digits[iVar12] = auVar2[0] + '0';
    iVar4 = iVar12 + 1;
  }
  iVar12 = iVar4;
  uVar10 = uVar10 - (auVar2._0_8_ & 0xffffffff) * uVar16;
  rem = (uVar10 << (bVar6 & 0x3f)) + rem_00;
  lVar9 = lVar9 + 1;
  if (rem <= uVar14) goto code_r0x0010c06a;
  goto LAB_0010c004;
code_r0x0010c06a:
  round_digit(digits,iVar12,uVar14,rem,uVar16 << (bVar6 & 0x3f),frac);
  uVar10 = (ulong)(10 - (int)lVar9);
LAB_0010c101:
  iVar13 = (int)uVar10 + iVar13 * -8;
  uVar8 = iVar13 + 0x15c;
  uVar17 = iVar13 + iVar12 + 0x15c;
  uVar7 = 1;
  uVar11 = iVar13 + 0x15b + iVar12;
  if ((int)uVar17 < 1) {
    uVar11 = 1 - uVar17;
  }
  uVar10 = (ulong)uVar11;
  if ((-1 < (int)uVar8) && ((int)uVar11 < iVar12 + 7)) {
    memcpy(__dest,digits,(long)iVar12);
    memset(__dest + iVar12,0x30,(ulong)uVar8);
    goto LAB_0010c1fc;
  }
  if (((int)uVar8 < 0) && ((0xfffffff9 < uVar8 || ((int)uVar11 < 4)))) {
    if ((int)uVar17 < 1) {
      __dest[0] = '0';
      __dest[1] = '.';
      memset(__dest + 2,0x30,(ulong)-uVar17);
      memcpy(__dest + (ulong)-uVar17 + 2,digits,(long)iVar12);
      uVar17 = (iVar12 - uVar17) + 2;
    }
    else {
      uVar10 = (ulong)uVar17;
      memcpy(__dest,digits,uVar10);
      __dest[uVar10] = '.';
      memcpy(__dest + uVar10 + 1,digits + uVar10,(ulong)(-iVar13 - 0x15c));
      uVar17 = iVar12 + 1;
    }
    goto LAB_0010c1fc;
  }
  iVar13 = ((int)uVar3 >> 0x1f) + 0x12;
  if (iVar12 <= iVar13) {
    iVar13 = iVar12;
  }
  *__dest = digits[0];
  if (1 < iVar12) {
    __dest[1] = '.';
    memcpy(__dest + 2,digits + 1,(ulong)(iVar13 - 1));
    uVar7 = iVar13 + 1;
  }
  uVar14 = (ulong)uVar7;
  __dest[uVar14] = 'e';
  uVar5 = uVar14 + 2;
  __dest[(long)(int)uVar7 + 1] =
       (iVar13 + uVar8 == 0 || SCARRY4(iVar13,uVar8) != (int)(iVar13 + uVar8) < 0) * '\x02' + '+';
  if ((int)uVar11 < 100) {
    uVar14 = uVar5 & 0xffffffff;
    if (9 < (int)uVar11) {
LAB_0010c232:
      __dest[uVar14 & 0xffffffff] = (char)(uVar10 / 10) + '0';
      uVar11 = (int)uVar10 + (int)(uVar10 / 10) * -10;
      uVar5 = (ulong)((int)uVar14 + 1);
    }
  }
  else {
    uVar14 = uVar14 + 3;
    __dest[uVar5] = (char)(uVar10 / 100) + '0';
    uVar11 = uVar11 + (int)(uVar10 / 100) * -100;
    uVar10 = (ulong)uVar11;
    if (9 < (int)uVar11) goto LAB_0010c232;
    __dest[uVar14] = '0';
    uVar5 = (ulong)(uVar7 + 4);
  }
  uVar17 = (int)uVar5 + 1;
  __dest[uVar5 & 0xffffffff] = (char)((int)uVar11 % 10) + '0';
LAB_0010c1fc:
  return uVar17 + bVar18;
}

Assistant:

static inline uint64_t get_dbits(double d) {
  uint64_t r;
  std::memcpy(&r, &d, sizeof(uint64_t));
  return r;
}